

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemAllowOverlap(void)

{
  ImGuiID IVar1;
  ImGuiContext_conflict *pIVar2;
  ImGuiID id;
  ImGuiContext_conflict *g;
  
  pIVar2 = GImGui;
  IVar1 = (GImGui->LastItemData).ID;
  if (GImGui->HoveredId == IVar1) {
    GImGui->HoveredIdAllowOverlap = true;
  }
  if (pIVar2->ActiveId == IVar1) {
    pIVar2->ActiveIdAllowOverlap = true;
  }
  return;
}

Assistant:

void ImGui::SetItemAllowOverlap()
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = g.LastItemData.ID;
    if (g.HoveredId == id)
        g.HoveredIdAllowOverlap = true;
    if (g.ActiveId == id)
        g.ActiveIdAllowOverlap = true;
}